

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
try_handle_next_demand
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this,unique_lock<std::mutex> *acquired_lock)

{
  atomic_refcounted_t *paVar1;
  activity_stats_t *paVar2;
  timer_manager_t *ptVar3;
  pop_result_t pVar4;
  int iVar5;
  rep rVar6;
  undefined4 extraout_var;
  long lVar7;
  execution_demand_t demand;
  execution_demand_t local_68;
  anon_class_16_2_3941ba46 local_30;
  
  local_68.m_receiver = (agent_t *)0x0;
  local_68.m_limit = (control_block_t *)0x0;
  local_68.m_mbox_id = 0;
  local_68.m_msg_type._M_target = (type_info *)&void::typeinfo;
  local_68.m_message_ref.m_obj = (message_t *)0x0;
  local_68.m_demand_handler = (demand_handler_pfn_t)0x0;
  pVar4 = event_queue_impl_t::pop(&this->m_event_queue,&local_68);
  if (pVar4 == empty_queue) {
    if ((this->m_activity_tracker).m_waiting.m_is_in_working == false) {
      (this->m_activity_tracker).m_waiting.m_is_in_working = true;
      rVar6 = std::chrono::_V2::steady_clock::now();
      (this->m_activity_tracker).m_waiting.m_work_started_at.__d.__r = rVar6;
      paVar2 = &(this->m_activity_tracker).m_waiting.m_work_activity;
      paVar2->m_count = paVar2->m_count + 1;
    }
    ptVar3 = (this->m_timer_manager)._M_t.
             super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>
             .super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl;
    iVar5 = (*ptVar3->_vptr_timer_manager_t[3])(ptVar3,60000000000);
    (this->m_sync_objects).m_status = waiting;
    lVar7 = std::chrono::_V2::steady_clock::now();
    local_30.this =
         (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
          *)(lVar7 + CONCAT44(extraout_var,iVar5));
    std::condition_variable::
    __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (&(this->m_sync_objects).m_wakeup_condition,acquired_lock,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&local_30);
    (this->m_sync_objects).m_status = working;
  }
  else {
    stats::activity_tracking_stuff::
    stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::stop
              (&(this->m_activity_tracker).m_waiting);
    (this->m_activity_tracker).m_working.m_is_in_working = true;
    rVar6 = std::chrono::_V2::steady_clock::now();
    (this->m_activity_tracker).m_working.m_work_started_at.__d.__r = rVar6;
    paVar2 = &(this->m_activity_tracker).m_working.m_work_activity;
    paVar2->m_count = paVar2->m_count + 1;
    local_30.this = this;
    local_30.demand = &local_68;
    helpers::
    unlock_do_and_lock_again<so_5::env_infrastructures::simple_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::try_handle_next_demand(std::unique_lock<std::mutex>&)::_lambda()_2_>
              (acquired_lock,&local_30);
    stats::activity_tracking_stuff::
    stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::stop
              (&(this->m_activity_tracker).m_working);
  }
  if (local_68.m_message_ref.m_obj != (message_t *)0x0) {
    LOCK();
    paVar1 = &(local_68.m_message_ref.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_68.m_message_ref.m_obj != (message_t *)0x0)) {
      (*(local_68.m_message_ref.m_obj)->_vptr_message_t[1])();
    }
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::try_handle_next_demand(
	std::unique_lock< std::mutex > & acquired_lock )
	{
		execution_demand_t demand;
		const auto pop_result = m_event_queue.pop( demand );
		// If there is no demands we must go to sleep for some time...
		if( event_queue_impl_t::pop_result_t::empty_queue == pop_result )
			{
				// Tracking time for 'waiting' state must be turned on.
				m_activity_tracker.wait_start_if_not_started();

				const auto sleep_time =
						m_timer_manager->timeout_before_nearest_timer(
								std::chrono::minutes(1) );

				m_sync_objects.m_status = main_thread_status_t::waiting;

				m_sync_objects.m_wakeup_condition.wait_for(
						acquired_lock,
						sleep_time );

				m_sync_objects.m_status = main_thread_status_t::working;
			}
		else
			{
				// Tracking time for 'waiting' must be turned off, but
				// tracking time for 'working' must be tuned on and then off again.
				m_activity_tracker.wait_stopped();
				m_activity_tracker.work_started();
				auto work_tracking_stopper = so_5::details::at_scope_exit(
						[this]{ m_activity_tracker.work_stopped(); } );

				// There is at least one demand to process.
				helpers::unlock_do_and_lock_again( acquired_lock,
					[this, &demand] {
						m_default_disp.handle_demand( demand );
					} );
			}
	}